

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O1

void icu_63::Grego::dayToFields
               (double day,int32_t *year,int32_t *month,int32_t *dom,int32_t *dow,int32_t *doy)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar2 = day + 719162.0;
  dVar3 = uprv_floor_63(dVar2 / 146097.0);
  dVar10 = dVar2 - dVar3 * 146097.0;
  dVar11 = (double)(int)dVar10;
  *doy = (int)dVar10;
  dVar10 = uprv_floor_63(dVar11 / 36524.0);
  dVar11 = dVar11 - dVar10 * 36524.0;
  dVar12 = (double)(int)dVar11;
  *doy = (int)dVar11;
  dVar11 = uprv_floor_63(dVar12 / 1461.0);
  dVar12 = dVar12 - dVar11 * 1461.0;
  dVar4 = (double)(int)dVar12;
  *doy = (int)dVar12;
  dVar12 = uprv_floor_63(dVar4 / 365.0);
  *doy = (int)(dVar4 - dVar12 * 365.0);
  iVar7 = (int)dVar10 * 100 + (int)dVar3 * 400 + (int)dVar11 * 4 + (int)dVar12;
  *year = iVar7;
  if (((int)dVar10 == 4) || ((int)dVar12 == 4)) {
    *doy = 0x16d;
  }
  else {
    *year = iVar7 + 1;
  }
  uVar1 = *year;
  bVar9 = true;
  if ((uVar1 & 3) == 0) {
    uVar5 = uVar1 * -0x3d70a3d7 + 0x51eb850;
    if ((uVar5 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
      bVar9 = 0xa3d70a < (uVar5 >> 4 | uVar1 * -0x70000000);
    }
    else {
      bVar9 = false;
    }
  }
  dVar2 = uprv_fmod_63(dVar2 + 1.0,7.0);
  iVar6 = (int)dVar2;
  iVar7 = iVar6 + 8;
  if (-1 < iVar6) {
    iVar7 = iVar6 + 1;
  }
  *dow = iVar7;
  iVar7 = 0;
  if ((int)(0x3c - (uint)bVar9) <= *doy) {
    iVar7 = bVar9 + 1;
  }
  iVar7 = (iVar7 + *doy) * 0xc + 6;
  iVar6 = iVar7 >> 0x1f;
  iVar7 = iVar7 / 0x16f + iVar6;
  iVar8 = iVar7 - iVar6;
  *month = iVar8;
  iVar7 = (iVar7 + 0xc) - iVar6;
  if (bVar9 != false) {
    iVar7 = iVar8;
  }
  *dom = (*doy - (int)*(short *)(DAYS_BEFORE + (long)iVar7 * 2)) + 1;
  *doy = *doy + 1;
  return;
}

Assistant:

void Grego::dayToFields(double day, int32_t& year, int32_t& month,
                        int32_t& dom, int32_t& dow, int32_t& doy) {

    // Convert from 1970 CE epoch to 1 CE epoch (Gregorian calendar)
    day += JULIAN_1970_CE - JULIAN_1_CE;

    // Convert from the day number to the multiple radix
    // representation.  We use 400-year, 100-year, and 4-year cycles.
    // For example, the 4-year cycle has 4 years + 1 leap day; giving
    // 1461 == 365*4 + 1 days.
    int32_t n400 = ClockMath::floorDivide(day, 146097, doy); // 400-year cycle length
    int32_t n100 = ClockMath::floorDivide(doy, 36524, doy); // 100-year cycle length
    int32_t n4   = ClockMath::floorDivide(doy, 1461, doy); // 4-year cycle length
    int32_t n1   = ClockMath::floorDivide(doy, 365, doy);
    year = 400*n400 + 100*n100 + 4*n4 + n1;
    if (n100 == 4 || n1 == 4) {
        doy = 365; // Dec 31 at end of 4- or 400-year cycle
    } else {
        ++year;
    }
    
    UBool isLeap = isLeapYear(year);
    
    // Gregorian day zero is a Monday.
    dow = (int32_t) uprv_fmod(day + 1, 7);
    dow += (dow < 0) ? (UCAL_SUNDAY + 7) : UCAL_SUNDAY;

    // Common Julian/Gregorian calculation
    int32_t correction = 0;
    int32_t march1 = isLeap ? 60 : 59; // zero-based DOY for March 1
    if (doy >= march1) {
        correction = isLeap ? 1 : 2;
    }
    month = (12 * (doy + correction) + 6) / 367; // zero-based month
    dom = doy - DAYS_BEFORE[month + (isLeap ? 12 : 0)] + 1; // one-based DOM
    doy++; // one-based doy
}